

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O0

Box * __thiscall
amrex::BATindexType_coarsenRatio::operator()(BATindexType_coarsenRatio *this,Box *bx)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  long *in_RDX;
  IndexType *pIVar8;
  uint *in_RSI;
  Box *in_RDI;
  Box *bx_1;
  Box result;
  int off_1;
  uint bitval;
  uint typ;
  int dir_1;
  int dir;
  IntVect off;
  int local_33c;
  int local_338;
  int local_334;
  int local_32c;
  int local_328;
  int local_324;
  int local_31c;
  int local_318;
  int local_314;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  bool local_265;
  undefined8 local_264;
  undefined8 local_25c;
  undefined8 local_254;
  IndexType local_24c [14];
  int local_214;
  uint *local_178;
  int local_168;
  IntVect local_164;
  uint *local_158;
  undefined8 *local_150;
  undefined4 local_114;
  uint *local_110;
  uint *local_e8;
  undefined8 *local_e0;
  IndexType *local_d8;
  uint local_6c;
  int local_68;
  int local_64;
  uint local_60;
  int local_5c;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  int local_40;
  int local_34;
  int local_28;
  int local_1c;
  int local_10;
  int local_4;
  
  local_178 = in_RSI + 1;
  lVar2 = *in_RDX;
  lVar3 = in_RDX[1];
  lVar4 = in_RDX[2];
  local_24c[0].itype = *(uint *)(in_RDX + 3);
  local_150 = &local_264;
  local_114 = 1;
  local_265 = true;
  if ((*local_178 == 1) && (local_265 = true, in_RSI[2] == 1)) {
    local_265 = in_RSI[3] != 1;
  }
  local_264 = lVar2;
  local_25c = lVar3;
  local_254 = lVar4;
  if (local_265) {
    local_264._0_4_ = (int)lVar2;
    local_50 = (int)local_264;
    local_54 = *local_178;
    local_4c = local_50;
    if (local_54 != 1) {
      if (local_54 == 2) {
        if ((int)local_264 < 0) {
          iVar7 = (int)local_264 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2a4 = -iVar7 / 2 + -1;
        }
        else {
          local_2a4 = (int)local_264 / 2;
        }
        local_4c = local_2a4;
      }
      else if (local_54 == 4) {
        if ((int)local_264 < 0) {
          iVar7 = (int)local_264 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2a8 = -iVar7 / 4 + -1;
        }
        else {
          local_2a8 = (int)local_264 / 4;
        }
        local_4c = local_2a8;
      }
      else {
        if ((int)local_264 < 0) {
          iVar7 = (int)local_264 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2ac = -iVar7 / (int)local_54 + -1;
        }
        else {
          local_2ac = (int)local_264 / (int)local_54;
        }
        local_4c = local_2ac;
      }
    }
    local_264._4_4_ = (int)((ulong)lVar2 >> 0x20);
    local_5c = local_264._4_4_;
    local_264._0_4_ = local_4c;
    local_60 = in_RSI[2];
    local_58 = local_5c;
    if (local_60 != 1) {
      if (local_60 == 2) {
        if (lVar2 < 0) {
          iVar7 = local_5c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2b4 = -iVar7 / 2 + -1;
        }
        else {
          local_2b4 = local_5c / 2;
        }
        local_58 = local_2b4;
      }
      else if (local_60 == 4) {
        if (lVar2 < 0) {
          iVar7 = local_5c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2b8 = -iVar7 / 4 + -1;
        }
        else {
          local_2b8 = local_5c / 4;
        }
        local_58 = local_2b8;
      }
      else {
        if (lVar2 < 0) {
          iVar7 = local_5c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2bc = -iVar7 / (int)local_60 + -1;
        }
        else {
          local_2bc = local_5c / (int)local_60;
        }
        local_58 = local_2bc;
      }
    }
    local_264._4_4_ = local_58;
    local_25c._0_4_ = (int)lVar3;
    local_68 = (int)local_25c;
    local_6c = in_RSI[3];
    local_64 = local_68;
    if (local_6c != 1) {
      if (local_6c == 2) {
        if ((int)local_25c < 0) {
          iVar7 = (int)local_25c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2c4 = -iVar7 / 2 + -1;
        }
        else {
          local_2c4 = (int)local_25c / 2;
        }
        local_64 = local_2c4;
      }
      else if (local_6c == 4) {
        if ((int)local_25c < 0) {
          iVar7 = (int)local_25c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2c8 = -iVar7 / 4 + -1;
        }
        else {
          local_2c8 = (int)local_25c / 4;
        }
        local_64 = local_2c8;
      }
      else {
        if ((int)local_25c < 0) {
          iVar7 = (int)local_25c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_2cc = -iVar7 / (int)local_6c + -1;
        }
        else {
          local_2cc = (int)local_25c / (int)local_6c;
        }
        local_64 = local_2cc;
      }
    }
    local_25c._4_4_ = (int)((ulong)lVar3 >> 0x20);
    local_28 = local_25c._4_4_;
    local_25c._0_4_ = local_64;
    local_d8 = local_24c;
    if (local_24c[0].itype == 0) {
      uVar1 = *local_178;
      if (uVar1 != 1) {
        if (uVar1 == 2) {
          if (lVar3 < 0) {
            local_28 = local_28 + 1;
            if (local_28 < 1) {
              local_28 = -local_28;
            }
            local_314 = -local_28 / 2 + -1;
          }
          else {
            local_314 = local_28 / 2;
          }
          local_28 = local_314;
        }
        else if (uVar1 == 4) {
          if (lVar3 < 0) {
            local_28 = local_28 + 1;
            if (local_28 < 1) {
              local_28 = -local_28;
            }
            local_318 = -local_28 / 4 + -1;
          }
          else {
            local_318 = local_28 / 4;
          }
          local_28 = local_318;
        }
        else {
          if (lVar3 < 0) {
            local_28 = local_28 + 1;
            if (local_28 < 1) {
              local_28 = -local_28;
            }
            local_31c = -local_28 / (int)uVar1 + -1;
          }
          else {
            local_31c = local_28 / (int)uVar1;
          }
          local_28 = local_31c;
        }
      }
      local_25c._4_4_ = local_28;
      local_254._0_4_ = (int)lVar4;
      local_34 = (int)local_254;
      uVar1 = in_RSI[2];
      if (uVar1 != 1) {
        if (uVar1 == 2) {
          if ((int)local_254 < 0) {
            iVar7 = (int)local_254 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_324 = -iVar7 / 2 + -1;
          }
          else {
            local_324 = (int)local_254 / 2;
          }
          local_34 = local_324;
        }
        else if (uVar1 == 4) {
          if ((int)local_254 < 0) {
            iVar7 = (int)local_254 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_328 = -iVar7 / 4 + -1;
          }
          else {
            local_328 = (int)local_254 / 4;
          }
          local_34 = local_328;
        }
        else {
          if ((int)local_254 < 0) {
            iVar7 = (int)local_254 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_32c = -iVar7 / (int)uVar1 + -1;
          }
          else {
            local_32c = (int)local_254 / (int)uVar1;
          }
          local_34 = local_32c;
        }
      }
      local_254._4_4_ = (int)((ulong)lVar4 >> 0x20);
      local_40 = local_254._4_4_;
      local_254._0_4_ = local_34;
      uVar1 = in_RSI[3];
      if (uVar1 != 1) {
        if (uVar1 == 2) {
          if (lVar4 < 0) {
            local_40 = local_40 + 1;
            if (local_40 < 1) {
              local_40 = -local_40;
            }
            local_334 = -local_40 / 2 + -1;
          }
          else {
            local_334 = local_40 / 2;
          }
          local_40 = local_334;
        }
        else if (uVar1 == 4) {
          if (lVar4 < 0) {
            local_40 = local_40 + 1;
            if (local_40 < 1) {
              local_40 = -local_40;
            }
            local_338 = -local_40 / 4 + -1;
          }
          else {
            local_338 = local_40 / 4;
          }
          local_40 = local_338;
        }
        else {
          if (lVar4 < 0) {
            local_40 = local_40 + 1;
            if (local_40 < 1) {
              local_40 = -local_40;
            }
            local_33c = -local_40 / (int)uVar1 + -1;
          }
          else {
            local_33c = local_40 / (int)uVar1;
          }
          local_40 = local_33c;
        }
      }
      local_254._4_4_ = local_40;
      local_25c = local_25c;
      local_254 = local_254;
    }
    else {
      local_158 = local_178;
      local_110 = local_178;
      local_e8 = local_178;
      local_e0 = local_150;
      IntVect::IntVect(&local_164,0);
      lVar2 = local_254;
      for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
        if (((local_24c[0].itype & 1 << ((byte)local_168 & 0x1f)) != 0) &&
           (*(int *)((long)&local_25c + (long)local_168 * 4 + 4) % (int)local_158[local_168] != 0))
        {
          local_164.vect[local_168] = 1;
        }
      }
      local_4 = local_25c._4_4_;
      uVar1 = *local_158;
      if (uVar1 != 1) {
        if (uVar1 == 2) {
          if (local_25c < 0) {
            iVar7 = local_25c._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_2dc = -iVar7 / 2 + -1;
          }
          else {
            local_2dc = local_25c._4_4_ / 2;
          }
          local_4 = local_2dc;
        }
        else if (uVar1 == 4) {
          if (local_25c < 0) {
            iVar7 = local_25c._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_2e0 = -iVar7 / 4 + -1;
          }
          else {
            local_2e0 = local_25c._4_4_ / 4;
          }
          local_4 = local_2e0;
        }
        else {
          if (local_25c < 0) {
            iVar7 = local_25c._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_2e4 = -iVar7 / (int)uVar1 + -1;
          }
          else {
            local_2e4 = local_25c._4_4_ / (int)uVar1;
          }
          local_4 = local_2e4;
        }
      }
      local_25c._4_4_ = local_4;
      local_10 = (int)local_254;
      uVar1 = local_158[1];
      if (uVar1 != 1) {
        if (uVar1 == 2) {
          if ((int)local_254 < 0) {
            iVar7 = (int)local_254 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_2ec = -iVar7 / 2 + -1;
          }
          else {
            local_2ec = (int)local_254 / 2;
          }
          local_10 = local_2ec;
        }
        else if (uVar1 == 4) {
          if ((int)local_254 < 0) {
            iVar7 = (int)local_254 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_2f0 = -iVar7 / 4 + -1;
          }
          else {
            local_2f0 = (int)local_254 / 4;
          }
          local_10 = local_2f0;
        }
        else {
          if ((int)local_254 < 0) {
            iVar7 = (int)local_254 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_2f4 = -iVar7 / (int)uVar1 + -1;
          }
          else {
            local_2f4 = (int)local_254 / (int)uVar1;
          }
          local_10 = local_2f4;
        }
      }
      local_1c = local_254._4_4_;
      local_254._0_4_ = local_10;
      uVar1 = local_158[2];
      if (uVar1 != 1) {
        if (uVar1 == 2) {
          if (lVar2 < 0) {
            local_1c = local_1c + 1;
            if (local_1c < 1) {
              local_1c = -local_1c;
            }
            local_2fc = -local_1c / 2 + -1;
          }
          else {
            local_2fc = local_1c / 2;
          }
          local_1c = local_2fc;
        }
        else if (uVar1 == 4) {
          if (lVar2 < 0) {
            local_1c = local_1c + 1;
            if (local_1c < 1) {
              local_1c = -local_1c;
            }
            local_300 = -local_1c / 4 + -1;
          }
          else {
            local_300 = local_1c / 4;
          }
          local_1c = local_300;
        }
        else {
          if (lVar2 < 0) {
            local_1c = local_1c + 1;
            if (local_1c < 1) {
              local_1c = -local_1c;
            }
            local_304 = -local_1c / (int)uVar1 + -1;
          }
          else {
            local_304 = local_1c / (int)uVar1;
          }
          local_1c = local_304;
        }
      }
      local_254._4_4_ = local_1c;
      local_25c._4_4_ = local_164.vect[0] + local_25c._4_4_;
      iVar7 = local_254._4_4_;
      local_254._0_4_ = local_164.vect[1] + (int)local_254;
      local_254._4_4_ = local_164.vect[2] + iVar7;
      local_25c = local_25c;
      local_254 = local_254;
    }
  }
  *(long *)(in_RDI->smallend).vect = local_264;
  *(long *)((in_RDI->smallend).vect + 2) = local_25c;
  *(long *)((in_RDI->bigend).vect + 1) = local_254;
  (in_RDI->btype).itype = local_24c[0].itype;
  uVar1 = *in_RSI;
  for (local_214 = 0; local_214 < 3; local_214 = local_214 + 1) {
    bVar6 = (byte)local_214;
    uVar5 = (uint)((uVar1 & 1 << (bVar6 & 0x1f)) != 0);
    (in_RDI->bigend).vect[local_214] =
         (uVar5 - (((in_RDI->btype).itype & 1 << (bVar6 & 0x1f)) != 0)) +
         (in_RDI->bigend).vect[local_214];
    pIVar8 = &in_RDI->btype;
    if (uVar5 == 0) {
      pIVar8->itype = (1 << (bVar6 & 0x1f) ^ 0xffffffffU) & pIVar8->itype;
    }
    else {
      pIVar8->itype = 1 << (bVar6 & 0x1f) | pIVar8->itype;
    }
  }
  return in_RDI;
}

Assistant:

Box operator() (const Box& bx) const noexcept {
        return amrex::convert(amrex::coarsen(bx,m_crse_ratio),m_typ);
    }